

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.c
# Opt level: O0

GLFWbool isValidElementForJoystick(_GLFWmapelement *e,_GLFWjoystick *js)

{
  _GLFWjoystick *js_local;
  _GLFWmapelement *e_local;
  GLFWbool local_4;
  
  if ((e->type == '\x03') && (js->hatCount <= (int)(uint)e->index >> 4)) {
    local_4 = 0;
  }
  else if ((e->type == '\x02') && (js->buttonCount <= (int)(uint)e->index)) {
    local_4 = 0;
  }
  else if ((e->type == '\x01') && (js->axisCount <= (int)(uint)e->index)) {
    local_4 = 0;
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

static GLFWbool isValidElementForJoystick(const _GLFWmapelement* e,
                                          const _GLFWjoystick* js)
{
    if (e->type == _GLFW_JOYSTICK_HATBIT && (e->index >> 4) >= js->hatCount)
        return GLFW_FALSE;
    else if (e->type == _GLFW_JOYSTICK_BUTTON && e->index >= js->buttonCount)
        return GLFW_FALSE;
    else if (e->type == _GLFW_JOYSTICK_AXIS && e->index >= js->axisCount)
        return GLFW_FALSE;

    return GLFW_TRUE;
}